

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.h
# Opt level: O3

void __thiscall CVmObjTadsInhQueue::~CVmObjTadsInhQueue(CVmObjTadsInhQueue *this)

{
  pfq_page *ppVar1;
  pfq_page *__ptr;
  
  __ptr = this->alloc_;
  while (__ptr != (pfq_page *)0x0) {
    ppVar1 = __ptr->nxt;
    free(__ptr);
    __ptr = ppVar1;
  }
  return;
}

Assistant:

~CVmObjTadsInhQueue()
    {
        pfq_page *cur;
        pfq_page *nxt;

        /* delete all of the allocated pages */
        for (cur = alloc_ ; cur != 0 ; cur = nxt)
        {
            /* remember the next page */
            nxt = cur->nxt;

            /* free this page */
            t3free(cur);
        }
    }